

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O1

float Map_MappingGetArea(Map_Man_t *pMan)

{
  Map_Node_t *p;
  Map_Super_t *pMVar1;
  int iVar2;
  Map_NodeVec_t *pMVar3;
  long lVar4;
  float local_1c;
  
  if (pMan->fUseProfile != 0) {
    Mio_LibraryCleanProfile2(pMan->pSuperLib->pGenlib);
  }
  pMVar3 = pMan->vMapObjs;
  if (pMVar3->nSize < 1) {
    local_1c = 0.0;
  }
  else {
    local_1c = 0.0;
    lVar4 = 0;
    do {
      p = pMVar3->pArray[lVar4];
      if ((p->nRefAct[2] != 0) && (iVar2 = Map_NodeIsBuf(p), iVar2 == 0)) {
        if ((p->pCutBest[0] == (Map_Cut_t *)0x0) && (p->pCutBest[1] == (Map_Cut_t *)0x0)) {
          __assert_fail("pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                        ,500,"float Map_MappingGetArea(Map_Man_t *)");
        }
        if ((p->nRefAct[0] < 1) && (p->nRefAct[1] < 1)) {
          __assert_fail("pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                        ,0x1f6,"float Map_MappingGetArea(Map_Man_t *)");
        }
        iVar2 = Map_NodeIsAnd(p);
        if (iVar2 != 0) {
          if ((p->pCutBest[0] != (Map_Cut_t *)0x0) &&
             ((0 < p->nRefAct[0] || (p->pCutBest[1] == (Map_Cut_t *)0x0)))) {
            pMVar1 = p->pCutBest[0]->M[0].pSuperBest;
            local_1c = local_1c + pMVar1->Area;
            if (pMan->fUseProfile != 0) {
              Mio_GateIncProfile2(pMVar1->pRoot);
            }
          }
          if ((p->pCutBest[1] != (Map_Cut_t *)0x0) &&
             ((0 < p->nRefAct[1] || (p->pCutBest[0] == (Map_Cut_t *)0x0)))) {
            pMVar1 = p->pCutBest[1]->M[1].pSuperBest;
            local_1c = local_1c + pMVar1->Area;
            if (pMan->fUseProfile != 0) {
              Mio_GateIncProfile2(pMVar1->pRoot);
            }
          }
        }
        if (((p->pCutBest[0] == (Map_Cut_t *)0x0) && (0 < p->nRefAct[0])) ||
           ((p->pCutBest[1] == (Map_Cut_t *)0x0 && (0 < p->nRefAct[1])))) {
          local_1c = local_1c + pMan->pSuperLib->AreaInv;
        }
      }
      lVar4 = lVar4 + 1;
      pMVar3 = pMan->vMapObjs;
    } while (lVar4 < pMVar3->nSize);
  }
  if (0 < pMan->nOutputs) {
    lVar4 = 0;
    do {
      iVar2 = Map_NodeIsVar(pMan->pOutputs[lVar4]);
      if ((iVar2 != 0) && (((ulong)pMan->pOutputs[lVar4] & 1) == 0)) {
        local_1c = local_1c + pMan->pSuperLib->AreaBuf;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pMan->nOutputs);
  }
  return local_1c;
}

Assistant:

float Map_MappingGetArea( Map_Man_t * pMan )
{
    Map_Node_t * pNode;
    float Area = 0.0;
    int i;
    if ( pMan->fUseProfile )
        Mio_LibraryCleanProfile2( pMan->pSuperLib->pGenlib );
    for ( i = 0; i < pMan->vMapObjs->nSize; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        if ( pNode->nRefAct[2] == 0 )
            continue;
        if ( Map_NodeIsBuf(pNode) )
            continue;
        // at least one phase has the best cut assigned
        assert( pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL );
        // at least one phase is used in the mapping
        assert( pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0 );
        // compute the array due to the supergate
        if ( Map_NodeIsAnd(pNode) )
        {
            // count area of the negative phase
            if ( pNode->pCutBest[0] && (pNode->nRefAct[0] > 0 || pNode->pCutBest[1] == NULL) )
            {
                Area += pNode->pCutBest[0]->M[0].pSuperBest->Area;
                if ( pMan->fUseProfile )
                    Mio_GateIncProfile2( pNode->pCutBest[0]->M[0].pSuperBest->pRoot );
            }
            // count area of the positive phase
            if ( pNode->pCutBest[1] && (pNode->nRefAct[1] > 0 || pNode->pCutBest[0] == NULL) )
            {
                Area += pNode->pCutBest[1]->M[1].pSuperBest->Area;
                if ( pMan->fUseProfile )
                    Mio_GateIncProfile2( pNode->pCutBest[1]->M[1].pSuperBest->pRoot );
            }
        }
        // count area of the interver if we need to implement one phase with another phase
        if ( (pNode->pCutBest[0] == NULL && pNode->nRefAct[0] > 0) || 
             (pNode->pCutBest[1] == NULL && pNode->nRefAct[1] > 0) )
            Area += pMan->pSuperLib->AreaInv;
    }
    // add buffers for each CO driven by a CI
    for ( i = 0; i < pMan->nOutputs; i++ )
        if ( Map_NodeIsVar(pMan->pOutputs[i]) && !Map_IsComplement(pMan->pOutputs[i]) )
            Area += pMan->pSuperLib->AreaBuf;
    return Area;
}